

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

int Abc_SopGetVarNum(char *pSop)

{
  int iVar1;
  
  iVar1 = -2;
  while( true ) {
    if (*pSop == '\0') {
      return -1;
    }
    if (*pSop == '\n') break;
    pSop = pSop + 1;
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int Abc_SopGetVarNum( char * pSop )
{
    char * pCur;
    for ( pCur = pSop; *pCur != '\n'; pCur++ )
        if ( *pCur == 0 )
            return -1;
    return pCur - pSop - 2;
}